

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void anon_unknown.dwarf_dce8de::addFileSetEntry
               (cmGeneratorTarget *headTarget,string *config,
               cmGeneratorExpressionDAGChecker *dagChecker,cmFileSet *fileSet,
               EvaluatedTargetPropertyEntries *entries)

{
  pointer *ppbVar1;
  cmMakefile *this;
  cmSourceFile *this_00;
  bool bVar2;
  bool bVar3;
  cmLocalGenerator *pcVar4;
  reference this_01;
  pointer this_02;
  cmake *this_03;
  reference pvVar5;
  string *psVar6;
  ulong uVar7;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *this_04;
  cmSourceGroup *pcVar8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var9;
  basic_string_view<char,_std::char_traits<char>_> bVar10;
  bool local_419;
  allocator<char> local_341;
  string local_340;
  basic_string_view<char,_std::char_traits<char>_> local_320;
  basic_string_view<char,_std::char_traits<char>_> local_310;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_300;
  basic_string_view<char,_std::char_traits<char>_> local_2f0;
  basic_string_view<char,_std::char_traits<char>_> local_2e0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_2d0;
  reference local_2c0;
  cmSourceGroup *sg;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *__range3;
  undefined1 local_298 [7];
  bool found;
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  string path;
  string w;
  string e;
  string local_210;
  basic_string_view<char,_std::char_traits<char>_> local_1f0;
  basic_string_view<char,_std::char_traits<char>_> local_1e0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1d0;
  cmSourceFile *local_1c0;
  cmSourceFile *sf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_190;
  EvaluatedTargetPropertyEntry local_170;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  undefined1 local_118 [8];
  TargetPropertyEntryFileSet tpe;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entryCge;
  undefined1 local_c8 [8];
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  *__range1_1;
  cmake *cm;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *dirCge;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  *__range1;
  bool contextSensitiveDirs;
  undefined1 local_60 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  dirCges;
  EvaluatedTargetPropertyEntries *entries_local;
  cmFileSet *fileSet_local;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  string *config_local;
  cmGeneratorTarget *headTarget_local;
  
  ppbVar1 = &dirs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  cmFileSet::CompileDirectoryEntries
            ((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
              *)ppbVar1,fileSet);
  pcVar4 = cmGeneratorTarget::GetLocalGenerator(headTarget);
  cmFileSet::EvaluateDirectoryEntries
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60,fileSet,
             (vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
              *)ppbVar1,pcVar4,config,headTarget,dagChecker);
  __range1._3_1_ = false;
  ppbVar1 = &dirs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end1 = std::
           vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
           ::begin((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    *)ppbVar1);
  dirCge = (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            *)std::
              vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
              ::end((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                     *)ppbVar1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                                     *)&dirCge), bVar2) {
    this_01 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
              ::operator*(&__end1);
    this_02 = std::
              unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              ::operator->(this_01);
    bVar2 = cmCompiledGeneratorExpression::GetHadContextSensitiveCondition(this_02);
    if (bVar2) {
      __range1._3_1_ = true;
      break;
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
    ::operator++(&__end1);
  }
  pcVar4 = cmGeneratorTarget::GetLocalGenerator(headTarget);
  this_03 = cmLocalGenerator::GetCMakeInstance(pcVar4);
  cmFileSet::CompileFileEntries
            ((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
              *)&__begin1_1,fileSet);
  __end1_1 = std::
             vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
             ::begin((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                      *)&__begin1_1);
  local_c8 = (undefined1  [8])
             std::
             vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
             ::end((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    *)&__begin1_1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                        *)local_c8);
    if (!bVar2) break;
    tpe.FileSet = (cmFileSet *)
                  __gnu_cxx::
                  __normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                  ::operator*(&__end1_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_130,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    unique_ptr(&local_138,
               (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                *)tpe.FileSet);
    TargetPropertyEntryFileSet::TargetPropertyEntryFileSet
              ((TargetPropertyEntryFileSet *)local_118,&local_130,__range1._3_1_,&local_138,fileSet,
               &cmGeneratorTarget::TargetPropertyEntry::NoLinkImplItem);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr(&local_138);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_130);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"",(allocator<char> *)((long)&__range2 + 7));
    EvaluateTargetPropertyEntry
              (&local_170,headTarget,config,&local_190,dagChecker,(TargetPropertyEntry *)local_118);
    std::
    vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ::emplace_back<(anonymous_namespace)::EvaluatedTargetPropertyEntry>
              (&entries->Entries,&local_170);
    EvaluatedTargetPropertyEntry::~EvaluatedTargetPropertyEntry(&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    pvVar5 = std::
             vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
             ::back(&entries->Entries);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&pvVar5->Values);
    file = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&pvVar5->Values);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&file);
      if (!bVar2) break;
      sf = (cmSourceFile *)
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      local_1c0 = cmMakefile::GetOrCreateSource(headTarget->Makefile,(string *)sf,false,Ambiguous);
      psVar6 = cmFileSet::GetType_abi_cxx11_(fileSet);
      _Var9 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
      local_1d0 = _Var9;
      bVar10 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("HEADERS",7);
      local_1f0 = bVar10;
      local_1e0 = bVar10;
      bVar2 = std::operator==(local_1d0,bVar10);
      this_00 = local_1c0;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_210,"HEADER_FILE_ONLY",
                   (allocator<char> *)(e.field_2._M_local_buf + 0xf));
        cmSourceFile::SetProperty(this_00,&local_210,"TRUE");
        std::__cxx11::string::~string((string *)&local_210);
        std::allocator<char>::~allocator((allocator<char> *)(e.field_2._M_local_buf + 0xf));
      }
      std::__cxx11::string::string((string *)(w.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(path.field_2._M_local_buf + 8));
      psVar6 = cmSourceFile::ResolveFullPath
                         (local_1c0,(string *)(w.field_2._M_local_buf + 8),
                          (string *)(path.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_278,(string *)psVar6);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_288);
        cmake::IssueMessage(this_03,AUTHOR_WARNING,(string *)((long)&path.field_2 + 8),
                            (cmListFileBacktrace *)local_288);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_288);
      }
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        bVar2 = false;
        this_04 = cmMakefile::GetSourceGroups(headTarget->Makefile);
        __end3 = std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::begin(this_04);
        sg = (cmSourceGroup *)
             std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::end(this_04);
        while( true ) {
          bVar3 = __gnu_cxx::operator!=
                            (&__end3,(__normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
                                      *)&sg);
          if (!bVar3) break;
          local_2c0 = __gnu_cxx::
                      __normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
                      ::operator*(&__end3);
          pcVar8 = cmSourceGroup::MatchChildrenFiles(local_2c0,(string *)local_278);
          if (pcVar8 != (cmSourceGroup *)0x0) {
            bVar2 = true;
            break;
          }
          __gnu_cxx::
          __normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
          ::operator++(&__end3);
        }
        if (!bVar2) {
          psVar6 = cmFileSet::GetType_abi_cxx11_(fileSet);
          _Var9 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
          local_2d0 = _Var9;
          bVar10 = (basic_string_view<char,_std::char_traits<char>_>)
                   ::cm::operator____s("HEADERS",7);
          local_2f0 = bVar10;
          local_2e0 = bVar10;
          bVar2 = std::operator==(local_2d0,bVar10);
          local_419 = true;
          if (!bVar2) {
            psVar6 = cmFileSet::GetType_abi_cxx11_(fileSet);
            _Var9 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
            local_300 = _Var9;
            bVar10 = (basic_string_view<char,_std::char_traits<char>_>)
                     ::cm::operator____s("CXX_MODULE_HEADER_UNITS",0x17);
            local_320 = bVar10;
            local_310 = bVar10;
            local_419 = std::operator==(local_300,bVar10);
          }
          if (local_419 != false) {
            this = headTarget->Makefile;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_340,"Header Files",&local_341);
            pcVar8 = cmMakefile::GetOrCreateSourceGroup(this,&local_340);
            cmSourceGroup::AddGroupFile(pcVar8,(string *)local_278);
            std::__cxx11::string::~string((string *)&local_340);
            std::allocator<char>::~allocator(&local_341);
          }
        }
        bVar2 = false;
      }
      else {
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_298);
          cmake::IssueMessage(this_03,FATAL_ERROR,(string *)((long)&w.field_2 + 8),
                              (cmListFileBacktrace *)local_298);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_298);
        }
        bVar2 = true;
      }
      std::__cxx11::string::~string((string *)local_278);
      std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(w.field_2._M_local_buf + 8));
      if (bVar2) goto LAB_006d40a0;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    bVar2 = false;
LAB_006d40a0:
    TargetPropertyEntryFileSet::~TargetPropertyEntryFileSet((TargetPropertyEntryFileSet *)local_118)
    ;
    if (bVar2) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
             *)&__begin1_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60);
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
             *)&dirs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void addFileSetEntry(cmGeneratorTarget const* headTarget,
                     std::string const& config,
                     cmGeneratorExpressionDAGChecker* dagChecker,
                     cmFileSet const* fileSet,
                     EvaluatedTargetPropertyEntries& entries)
{
  auto dirCges = fileSet->CompileDirectoryEntries();
  auto dirs = fileSet->EvaluateDirectoryEntries(
    dirCges, headTarget->GetLocalGenerator(), config, headTarget, dagChecker);
  bool contextSensitiveDirs = false;
  for (auto const& dirCge : dirCges) {
    if (dirCge->GetHadContextSensitiveCondition()) {
      contextSensitiveDirs = true;
      break;
    }
  }
  cmake* cm = headTarget->GetLocalGenerator()->GetCMakeInstance();
  for (auto& entryCge : fileSet->CompileFileEntries()) {
    TargetPropertyEntryFileSet tpe(dirs, contextSensitiveDirs,
                                   std::move(entryCge), fileSet);
    entries.Entries.emplace_back(
      EvaluateTargetPropertyEntry(headTarget, config, "", dagChecker, tpe));
    for (auto const& file : entries.Entries.back().Values) {
      auto* sf = headTarget->Makefile->GetOrCreateSource(file);
      if (fileSet->GetType() == "HEADERS"_s) {
        sf->SetProperty("HEADER_FILE_ONLY", "TRUE");
      }

#ifndef CMAKE_BOOTSTRAP
      std::string e;
      std::string w;
      auto path = sf->ResolveFullPath(&e, &w);
      if (!w.empty()) {
        cm->IssueMessage(MessageType::AUTHOR_WARNING, w,
                         headTarget->GetBacktrace());
      }
      if (path.empty()) {
        if (!e.empty()) {
          cm->IssueMessage(MessageType::FATAL_ERROR, e,
                           headTarget->GetBacktrace());
        }
        return;
      }
      bool found = false;
      for (auto const& sg : headTarget->Makefile->GetSourceGroups()) {
        if (sg.MatchChildrenFiles(path)) {
          found = true;
          break;
        }
      }
      if (!found) {
        if (fileSet->GetType() == "HEADERS"_s ||
            fileSet->GetType() == "CXX_MODULE_HEADER_UNITS"_s) {
          headTarget->Makefile->GetOrCreateSourceGroup("Header Files")
            ->AddGroupFile(path);
        }
      }
#endif
    }
  }
}